

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O0

void __thiscall QWidgetWindow::handleFocusInEvent(QWidgetWindow *this,QFocusEvent *e)

{
  int iVar1;
  FocusWidgets in_stack_0000000c;
  QWidget *focusWidget;
  undefined8 local_18;
  
  local_18 = (QWidget *)0x0;
  iVar1 = QFocusEvent::reason();
  if (iVar1 == 2) {
    local_18 = getFocusWidget((QWidgetWindow *)focusWidget,in_stack_0000000c);
  }
  else {
    iVar1 = QFocusEvent::reason();
    if (iVar1 == 1) {
      local_18 = getFocusWidget((QWidgetWindow *)focusWidget,in_stack_0000000c);
    }
  }
  if (local_18 != (QWidget *)0x0) {
    QWidget::setFocus((QWidget *)0x3b421e);
  }
  return;
}

Assistant:

void QWidgetWindow::handleFocusInEvent(QFocusEvent *e)
{
    QWidget *focusWidget = nullptr;
    if (e->reason() == Qt::BacktabFocusReason)
        focusWidget = getFocusWidget(LastFocusWidget);
    else if (e->reason() == Qt::TabFocusReason)
        focusWidget = getFocusWidget(FirstFocusWidget);

    if (focusWidget != nullptr)
        focusWidget->setFocus();
}